

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

PyTypeObject * pybind11::detail::make_default_metaclass(void)

{
  int iVar1;
  PyObject *pPVar2;
  PyTypeObject *ptr;
  handle *this;
  handle *this_00;
  PyTypeObject *pPVar3;
  PyTypeObject *type;
  PyHeapTypeObject *heap_type;
  object name_obj;
  char *name;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  handle in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  PyTypeObject *c;
  str *in_stack_ffffffffffffffb0;
  handle in_stack_ffffffffffffffc0;
  handle local_18 [2];
  char *local_8;
  
  local_8 = "pybind11_type";
  pPVar2 = (PyObject *)PyUnicode_FromString();
  pybind11::handle::handle(local_18,pPVar2);
  reinterpret_steal<pybind11::object>(in_stack_ffffffffffffff98);
  ptr = (PyTypeObject *)(*_list_long_reads_datastores_abi_cxx11_)(&PyType_Type,0);
  if (ptr == (PyTypeObject *)0x0) {
    pybind11_fail(in_stack_ffffffffffffffa0);
  }
  c = ptr;
  this = pybind11::handle::inc_ref
                   ((handle *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  pPVar2 = pybind11::handle::ptr(this);
  ptr[2].tp_basicsize = (Py_ssize_t)pPVar2;
  this_00 = pybind11::handle::inc_ref
                      ((handle *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  pPVar2 = pybind11::handle::ptr(this_00);
  ptr[2].tp_dealloc = (destructor)pPVar2;
  ptr->tp_name = "pybind11_type";
  pPVar3 = type_incref((PyTypeObject *)0x24f659);
  ptr->tp_base = pPVar3;
  ptr->tp_flags = 0x600;
  ptr->tp_call = pybind11_meta_call;
  ptr->tp_setattro = pybind11_meta_setattro;
  ptr->tp_getattro = pybind11_meta_getattro;
  ptr->tp_dealloc = pybind11_meta_dealloc;
  iVar1 = PyType_Ready(ptr);
  if (iVar1 < 0) {
    pybind11_fail((char *)this);
  }
  pybind11::handle::handle((handle *)&stack0xffffffffffffffc0,(PyObject *)ptr);
  str::str(in_stack_ffffffffffffffb0,(char *)c);
  setattr(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb0,
          (handle)in_stack_ffffffffffffffb0);
  str::~str((str *)0x24f738);
  object::~object((object *)0x24f74b);
  return ptr;
}

Assistant:

inline PyTypeObject* make_default_metaclass() {
    constexpr auto *name = "pybind11_type";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto heap_type = (PyHeapTypeObject *) PyType_Type.tp_alloc(&PyType_Type, 0);
    if (!heap_type)
        pybind11_fail("make_default_metaclass(): error allocating metaclass!");

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyType_Type);
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_call = pybind11_meta_call;

    type->tp_setattro = pybind11_meta_setattro;
#if PY_MAJOR_VERSION >= 3
    type->tp_getattro = pybind11_meta_getattro;
#endif

    type->tp_dealloc = pybind11_meta_dealloc;

    if (PyType_Ready(type) < 0)
        pybind11_fail("make_default_metaclass(): failure in PyType_Ready()!");

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    return type;
}